

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyleditemdelegate.cpp
# Opt level: O0

QSize __thiscall
QStyledItemDelegate::sizeHint
          (QStyledItemDelegate *this,QStyleOptionViewItem *option,QModelIndex *index)

{
  bool bVar1;
  QWidget *pQVar2;
  QStyleOptionViewItem *this_00;
  undefined8 in_RDX;
  QStyleOptionViewItem *in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  QStyle *style;
  QWidget *widget;
  QStyleOptionViewItem opt;
  QVariant value;
  QStyleOptionViewItem *in_stack_fffffffffffffea8;
  QStyleOptionViewItem *in_stack_fffffffffffffeb0;
  QVariant *in_stack_fffffffffffffeb8;
  QModelIndex *in_stack_fffffffffffffec8;
  QSize local_108;
  undefined1 local_100 [8];
  undefined1 local_f8 [208];
  anon_union_24_3_e3d07ef4_for_data local_28;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_28._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QModelIndex::data(in_stack_fffffffffffffec8,(int)((ulong)in_RDI >> 0x20));
  bVar1 = ::QVariant::isValid((QVariant *)in_stack_fffffffffffffeb0);
  if (bVar1) {
    local_108 = qvariant_cast<QSize>(in_stack_fffffffffffffeb8);
  }
  else {
    memset(local_f8,0xaa,0xd0);
    QStyleOptionViewItem::QStyleOptionViewItem(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    (**(code **)(*in_RDI + 0xb8))(in_RDI,local_f8,in_RDX);
    pQVar2 = QStyledItemDelegatePrivate::widget(in_RSI);
    if (pQVar2 == (QWidget *)0x0) {
      this_00 = (QStyleOptionViewItem *)QApplication::style();
    }
    else {
      this_00 = (QStyleOptionViewItem *)QWidget::style((QWidget *)in_stack_fffffffffffffea8);
    }
    QSize::QSize((QSize *)this_00);
    local_108 = (QSize)(**(code **)(*(long *)&this_00->super_QStyleOption + 0xe8))
                                 (this_00,0x16,local_f8,local_100,pQVar2);
    QStyleOptionViewItem::~QStyleOptionViewItem(this_00);
  }
  ::QVariant::~QVariant((QVariant *)&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_108;
  }
  __stack_chk_fail();
}

Assistant:

QSize QStyledItemDelegate::sizeHint(const QStyleOptionViewItem &option,
                                   const QModelIndex &index) const
{
    QVariant value = index.data(Qt::SizeHintRole);
    if (value.isValid())
        return qvariant_cast<QSize>(value);

    QStyleOptionViewItem opt = option;
    initStyleOption(&opt, index);
    const QWidget *widget = QStyledItemDelegatePrivate::widget(option);
    QStyle *style = widget ? widget->style() : QApplication::style();
    return style->sizeFromContents(QStyle::CT_ItemViewItem, &opt, QSize(), widget);
}